

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O2

void getKeyCode(char *attrName,int argc,char **argv,int *i,int part,SetAttrVector *attrs)

{
  TypedAttribute<Imf_3_2::KeyCode> *this;
  invalid_argument *this_00;
  int iVar1;
  allocator<char> local_81;
  string local_80 [32];
  SetAttr local_60;
  
  if (*i <= argc + -8) {
    this = (TypedAttribute<Imf_3_2::KeyCode> *)operator_new(0x28);
    Imf_3_2::TypedAttribute<Imf_3_2::KeyCode>::TypedAttribute(this);
    std::__cxx11::string::string<std::allocator<char>>(local_80,attrName,&local_81);
    std::__cxx11::string::string((string *)&local_60,local_80);
    local_60.part = part;
    local_60.attr = (Attribute *)this;
    std::vector<SetAttr,_std::allocator<SetAttr>_>::emplace_back<SetAttr>(attrs,&local_60);
    std::__cxx11::string::~string((string *)&local_60);
    std::__cxx11::string::~string(local_80);
    iVar1 = (int)this + 8;
    strtol(argv[(long)*i + 1],(char **)0x0,0);
    Imf_3_2::KeyCode::setFilmMfcCode(iVar1);
    strtol(argv[(long)*i + 2],(char **)0x0,0);
    Imf_3_2::KeyCode::setFilmType(iVar1);
    strtol(argv[(long)*i + 3],(char **)0x0,0);
    Imf_3_2::KeyCode::setPrefix(iVar1);
    strtol(argv[(long)*i + 4],(char **)0x0,0);
    Imf_3_2::KeyCode::setCount(iVar1);
    strtol(argv[(long)*i + 5],(char **)0x0,0);
    Imf_3_2::KeyCode::setPerfOffset(iVar1);
    strtol(argv[(long)*i + 6],(char **)0x0,0);
    Imf_3_2::KeyCode::setPerfsPerFrame(iVar1);
    strtol(argv[(long)*i + 7],(char **)0x0,0);
    Imf_3_2::KeyCode::setPerfsPerCount(iVar1);
    *i = *i + 8;
    return;
  }
  this_00 = (invalid_argument *)__cxa_allocate_exception(0x10);
  std::invalid_argument::invalid_argument(this_00,"Expected a key code");
  __cxa_throw(this_00,&std::invalid_argument::typeinfo,std::invalid_argument::~invalid_argument);
}

Assistant:

void
getKeyCode (
    const char     attrName[],
    int            argc,
    char**         argv,
    int&           i,
    int            part,
    SetAttrVector& attrs)
{
    if (i > argc - 8)
        throw invalid_argument("Expected a key code");

    KeyCodeAttribute* a = new KeyCodeAttribute;
    attrs.push_back (SetAttr (attrName, part, a));

    a->value ().setFilmMfcCode (strtol (argv[i + 1], 0, 0));
    a->value ().setFilmType (strtol (argv[i + 2], 0, 0));
    a->value ().setPrefix (strtol (argv[i + 3], 0, 0));
    a->value ().setCount (strtol (argv[i + 4], 0, 0));
    a->value ().setPerfOffset (strtol (argv[i + 5], 0, 0));
    a->value ().setPerfsPerFrame (strtol (argv[i + 6], 0, 0));
    a->value ().setPerfsPerCount (strtol (argv[i + 7], 0, 0));
    i += 8;
}